

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_2a6a20::BIP32PubkeyProvider::ToNormalizedString
          (BIP32PubkeyProvider *this,SigningProvider *arg,string *out,DescriptorCache *cache)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *__args;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  ulong uVar8;
  pointer puVar9;
  pointer *__ptr_3;
  ulong unaff_RBP;
  pointer *__ptr;
  ulong uVar10;
  undefined4 *puVar11;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  CExtPubKey *pCVar15;
  long lVar16;
  long in_FS_OFFSET;
  byte bVar17;
  Span<const_unsigned_char> s;
  KeyPath end_path;
  KeyOriginInfo origin;
  string origin_str;
  CExtKey xprv;
  CExtKey lh_xprv;
  CExtPubKey xpub;
  CKeyID id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_298;
  uchar local_278 [8];
  void *local_270;
  iterator iStack_268;
  uint *local_260;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  undefined1 local_1b8 [112];
  uchar local_148;
  undefined1 local_140 [32];
  uchar auStack_120 [16];
  bool local_110;
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_108;
  undefined1 local_100 [56];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_c8;
  CExtPubKey local_c0;
  CKeyID local_4c;
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_derive == HARDENED) {
    (anonymous_namespace)::BIP32PubkeyProvider::ToNormalizedString();
LAB_001676dd:
    bVar4 = true;
  }
  else {
    puVar9 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2;
    uVar10 = uVar8 & 0xffffffff;
    uVar14 = uVar8 & 0xffffffff;
    do {
      uVar10 = uVar10 - 1;
      uVar13 = (uint)uVar14;
      uVar5 = (int)(uint)uVar8 >> 0x1f & (uint)uVar8;
      if ((int)uVar13 < 1) break;
      if (uVar8 <= uVar10) goto LAB_00167b51;
      uVar14 = (ulong)(uVar13 - 1);
      uVar5 = uVar13;
    } while (-1 < (int)puVar9[uVar10]);
    if (uVar5 == 0) {
      (anonymous_namespace)::BIP32PubkeyProvider::ToNormalizedString();
      goto LAB_001676dd;
    }
    local_270 = (void *)0x0;
    iStack_268._M_current = (uint *)0x0;
    local_260 = (uint *)0x0;
    if (0 < (int)uVar5) {
      unaff_RBP = 0;
LAB_001673d4:
      puVar9 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (unaff_RBP <
          (ulong)((long)(this->m_path).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar9 >> 2))
      goto code_r0x001673f2;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   unaff_RBP);
LAB_00167b51:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00167dd9;
        uVar8 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
        goto LAB_00167b76;
      }
      goto LAB_00167dd9;
    }
    unaff_RBP = 0;
LAB_00167425:
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    puVar9 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = (long)(this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2;
    if ((int)unaff_RBP < (int)uVar8) {
      unaff_RBP = unaff_RBP & 0xffffffff;
      lVar16 = unaff_RBP * 4;
      do {
        if (uVar8 <= unaff_RBP) goto LAB_00167b76;
        if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_298,
                     (iterator)
                     local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish,(uint *)((long)puVar9 + lVar16));
        }
        else {
          *local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = *(uint *)((long)puVar9 + lVar16);
          local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        unaff_RBP = unaff_RBP + 1;
        puVar9 = (this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar8 = (long)(this->m_path).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2;
        lVar16 = lVar16 + 4;
      } while ((int)unaff_RBP < (int)uVar8);
    }
    CPubKey::GetID(&local_4c,(CPubKey *)&this->field_0x3c);
    local_278[0] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[0];
    local_278[1] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[1];
    local_278[2] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[2];
    local_278[3] = local_4c.super_uint160.super_base_blob<160U>.m_data._M_elems[3];
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_c0.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_c0.pubkey.vch[0] = 0xff;
    local_100[0x1c] = '\0';
    local_100[0x1d] = '\0';
    local_100[0x1e] = '\0';
    local_100[0x1f] = '\0';
    local_100[0x20] = '\0';
    local_100[0x21] = '\0';
    local_100[0x22] = '\0';
    local_100[0x23] = '\0';
    local_100[0x24] = '\0';
    local_100[0x25] = '\0';
    local_100[0x26] = '\0';
    local_100[0x27] = '\0';
    local_100[0x28] = '\0';
    local_100[0x29] = '\0';
    local_100[0x2a] = '\0';
    local_100[0x2b] = '\0';
    local_100[0xc] = '\0';
    local_100[0xd] = '\0';
    local_100[0xe] = '\0';
    local_100[0xf] = '\0';
    local_100[0x10] = '\0';
    local_100[0x11] = '\0';
    local_100[0x12] = '\0';
    local_100[0x13] = '\0';
    local_100[0x14] = '\0';
    local_100[0x15] = '\0';
    local_100[0x16] = '\0';
    local_100[0x17] = '\0';
    local_100[0x18] = '\0';
    local_100[0x19] = '\0';
    local_100[0x1a] = '\0';
    local_100[0x1b] = '\0';
    local_100[0x30] = false;
    local_c8._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
    if (cache != (DescriptorCache *)0x0) {
      DescriptorCache::GetCachedLastHardenedExtPubKey
                (cache,(this->super_PubkeyProvider).m_expr_index,&local_c0);
    }
    if (((local_c0.pubkey.vch[0] & 0xfe) == 2) ||
       ((local_c0.pubkey.vch[0] < 8 && ((0xd0U >> (local_c0.pubkey.vch[0] & 0x1f) & 1) != 0)))) {
LAB_001675ef:
      if ((((local_c0.pubkey.vch[0] & 0xfe) != 2) && (1 < local_c0.pubkey.vch[0] - 6)) &&
         (local_c0.pubkey.vch[0] != 4)) {
LAB_00167ba1:
        __assert_fail("xpub.pubkey.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x21e,
                      "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                     );
      }
      s.m_size = 4;
      s.m_data = local_278;
      HexStr_abi_cxx11_((string *)local_140,s);
      FormatHDKeypath_abi_cxx11_
                (&local_1d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_270,false)
      ;
      pcVar2 = local_140 + 0x10;
      uVar8 = local_1d8._M_string_length + CONCAT44(local_140._12_4_,local_140._8_4_);
      uVar10 = 0xf;
      if ((pointer)local_140._0_8_ != pcVar2) {
        uVar10 = CONCAT44(local_140._20_4_,local_140._16_4_);
      }
      if (uVar10 < uVar8) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          uVar12 = local_1d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < uVar8) goto LAB_00167690;
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1d8,0,0,(char *)local_140._0_8_,
                         CONCAT44(local_140._12_4_,local_140._8_4_));
      }
      else {
LAB_00167690:
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_140,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      }
      local_1b8._0_8_ = (pbVar6->_M_dataplus)._M_p;
      paVar1 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ == paVar1) {
        local_1b8._16_8_ = paVar1->_M_allocated_capacity;
        local_1b8._24_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1b8._0_8_ = local_1b8 + 0x10;
      }
      else {
        local_1b8._16_8_ = paVar1->_M_allocated_capacity;
      }
      local_1b8._8_8_ = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar1;
      pbVar6->_M_string_length = 0;
      paVar1->_M_local_buf[0] = '\0';
      paVar1 = &local_1d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_140._0_8_ != pcVar2) {
        operator_delete((void *)local_140._0_8_,CONCAT44(local_140._20_4_,local_140._16_4_) + 1);
      }
      std::operator+(&local_218,"[",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8)
      ;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_218,"]");
      paVar3 = &local_1f8.field_2;
      local_1f8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p == paVar7) {
        local_1f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1f8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_1f8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      EncodeExtPubKey_abi_cxx11_(&local_238,&local_c0);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar3) {
        uVar12 = local_1f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_238._M_string_length + local_1f8._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          uVar12 = local_238.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_238._M_string_length + local_1f8._M_string_length)
        goto LAB_0016786c;
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_238,0,0,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      }
      else {
LAB_0016786c:
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_1f8,local_238._M_dataplus._M_p,local_238._M_string_length);
      }
      local_1d8._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p == paVar7) {
        local_1d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
        local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_1d8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1d8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      }
      local_1d8._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      paVar7->_M_local_buf[0] = '\0';
      FormatHDKeypath_abi_cxx11_(&local_258,&local_298,false);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        uVar12 = local_1d8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_258._M_string_length + local_1d8._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          uVar12 = local_258.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_258._M_string_length + local_1d8._M_string_length)
        goto LAB_00167939;
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_258,0,0,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      }
      else {
LAB_00167939:
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_1d8,local_258._M_dataplus._M_p,local_258._M_string_length);
      }
      local_140._0_8_ = (pbVar6->_M_dataplus)._M_p;
      paVar7 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._0_8_ == paVar7) {
        uVar12 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        local_140._16_4_ = (undefined4)paVar7->_M_allocated_capacity;
        local_140._20_4_ = (undefined4)(paVar7->_M_allocated_capacity >> 0x20);
        local_140._24_4_ = (undefined4)uVar12;
        local_140._28_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        local_140._0_8_ = pcVar2;
      }
      else {
        local_140._16_4_ = (undefined4)paVar7->_M_allocated_capacity;
        local_140._20_4_ = (undefined4)(paVar7->_M_allocated_capacity >> 0x20);
      }
      local_140._8_4_ = (undefined4)pbVar6->_M_string_length;
      local_140._12_4_ = (undefined4)(pbVar6->_M_string_length >> 0x20);
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
      pbVar6->_M_string_length = 0;
      paVar7->_M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (out,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140)
      ;
      if ((pointer)local_140._0_8_ != pcVar2) {
        operator_delete((void *)local_140._0_8_,CONCAT44(local_140._20_4_,local_140._16_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((this->m_derive != NO) &&
         (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (out,"/*"), this->m_derive != UNHARDENED)) {
        __assert_fail("m_derive == DeriveType::UNHARDENED",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/descriptor.cpp"
                      ,0x225,
                      "virtual bool (anonymous namespace)::BIP32PubkeyProvider::ToNormalizedString(const SigningProvider &, std::string &, const DescriptorCache *) const"
                     );
      }
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
      }
      bVar4 = true;
    }
    else {
      local_140[0x1c] = '\0';
      local_140[0x1d] = '\0';
      local_140[0x1e] = '\0';
      local_140[0x1f] = '\0';
      auStack_120[0] = '\0';
      auStack_120[1] = '\0';
      auStack_120[2] = '\0';
      auStack_120[3] = '\0';
      auStack_120[4] = '\0';
      auStack_120[5] = '\0';
      auStack_120[6] = '\0';
      auStack_120[7] = '\0';
      auStack_120[8] = '\0';
      auStack_120[9] = '\0';
      auStack_120[10] = '\0';
      auStack_120[0xb] = '\0';
      local_140[0xc] = '\0';
      local_140[0xd] = '\0';
      local_140[0xe] = '\0';
      local_140[0xf] = '\0';
      local_140[0x10] = '\0';
      local_140[0x11] = '\0';
      local_140[0x12] = '\0';
      local_140[0x13] = '\0';
      local_140[0x14] = '\0';
      local_140[0x15] = '\0';
      local_140[0x16] = '\0';
      local_140[0x17] = '\0';
      local_140[0x18] = '\0';
      local_140[0x19] = '\0';
      local_140[0x1a] = '\0';
      local_140[0x1b] = '\0';
      local_110 = false;
      local_108._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
      bVar4 = GetDerivedExtKey(this,arg,(CExtKey *)local_140,(CExtKey *)local_100);
      if (bVar4) {
        CExtKey::Neuter((CExtPubKey *)local_1b8,(CExtKey *)local_100);
        puVar11 = (undefined4 *)local_1b8;
        pCVar15 = &local_c0;
        for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
          *(undefined4 *)pCVar15->version = *puVar11;
          puVar11 = puVar11 + (ulong)bVar17 * -2 + 1;
          pCVar15 = (CExtPubKey *)((long)pCVar15 + ((ulong)bVar17 * -2 + 1) * 4);
        }
        local_c0.pubkey.vch[0x40] = local_148;
        if (local_108._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
          SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                    ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_108,
                     local_108._M_head_impl);
        }
        if (bVar4) goto LAB_001675ef;
      }
      else if (local_108._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
        SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                  ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_108,
                   local_108._M_head_impl);
      }
      bVar4 = false;
    }
    if (local_c8._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
      SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
                ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_c8,
                 local_c8._M_head_impl);
    }
    if (local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_298.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_298.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_270 != (void *)0x0) {
      operator_delete(local_270,(long)local_260 - (long)local_270);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
LAB_00167dd9:
  __stack_chk_fail();
code_r0x001673f2:
  __args = puVar9 + unaff_RBP;
  if (iStack_268._M_current == local_260) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_270,iStack_268,__args);
  }
  else {
    *iStack_268._M_current = *__args;
    iStack_268._M_current = iStack_268._M_current + 1;
  }
  unaff_RBP = unaff_RBP + 1;
  if (unaff_RBP == uVar5) goto LAB_00167425;
  goto LAB_001673d4;
LAB_00167b76:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",unaff_RBP
               ,uVar8);
    goto LAB_00167ba1;
  }
  goto LAB_00167dd9;
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& out, const DescriptorCache* cache) const override
    {
        if (m_derive == DeriveType::HARDENED) {
            out = ToString(StringType::PUBLIC, /*normalized=*/true);

            return true;
        }
        // Step backwards to find the last hardened step in the path
        int i = (int)m_path.size() - 1;
        for (; i >= 0; --i) {
            if (m_path.at(i) >> 31) {
                break;
            }
        }
        // Either no derivation or all unhardened derivation
        if (i == -1) {
            out = ToString();
            return true;
        }
        // Get the path to the last hardened stup
        KeyOriginInfo origin;
        int k = 0;
        for (; k <= i; ++k) {
            // Add to the path
            origin.path.push_back(m_path.at(k));
        }
        // Build the remaining path
        KeyPath end_path;
        for (; k < (int)m_path.size(); ++k) {
            end_path.push_back(m_path.at(k));
        }
        // Get the fingerprint
        CKeyID id = m_root_extkey.pubkey.GetID();
        std::copy(id.begin(), id.begin() + 4, origin.fingerprint);

        CExtPubKey xpub;
        CExtKey lh_xprv;
        // If we have the cache, just get the parent xpub
        if (cache != nullptr) {
            cache->GetCachedLastHardenedExtPubKey(m_expr_index, xpub);
        }
        if (!xpub.pubkey.IsValid()) {
            // Cache miss, or nor cache, or need privkey
            CExtKey xprv;
            if (!GetDerivedExtKey(arg, xprv, lh_xprv)) return false;
            xpub = lh_xprv.Neuter();
        }
        assert(xpub.pubkey.IsValid());

        // Build the string
        std::string origin_str = HexStr(origin.fingerprint) + FormatHDKeypath(origin.path);
        out = "[" + origin_str + "]" + EncodeExtPubKey(xpub) + FormatHDKeypath(end_path);
        if (IsRange()) {
            out += "/*";
            assert(m_derive == DeriveType::UNHARDENED);
        }
        return true;
    }